

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O1

string * istr_abi_cxx11_(string *__return_storage_ptr__,int b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  if (b == 0x7fffffff) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x107005);
  }
  else {
    __val = -b;
    if (0 < b) {
      __val = b;
    }
    __len = 1;
    if (9 < __val) {
      uVar3 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar2 = (uint)uVar3;
        if (uVar2 < 100) {
          __len = __len - 2;
          goto LAB_00104a25;
        }
        if (uVar2 < 1000) {
          __len = __len - 1;
          goto LAB_00104a25;
        }
        if (uVar2 < 10000) goto LAB_00104a25;
        uVar3 = uVar3 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar2);
      __len = __len + 1;
    }
LAB_00104a25:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(b >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)b >> 0x1f) + (long)local_50[0]),__len,__val);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string istr(int b) {
  std::string result = "";
  if (b == minf) {
    result = "-inf";
  } else if (b == pinf) {
    result = "+inf"; 
  } else {
    result = std::to_string(b);
  }
  return result;
}